

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<QSimplexVariable_*,_double> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QSimplexVariable*,double>>::findNode<QSimplexVariable*>
          (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *this,QSimplexVariable **key)

{
  long lVar1;
  bool bVar2;
  Node<QSimplexVariable_*,_double> *pNVar3;
  QSimplexVariable **in_RDI;
  long in_FS_OFFSET;
  Bucket bucket;
  Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findBucket<QSimplexVariable*>(in_stack_ffffffffffffffe0,in_RDI);
  bVar2 = Data<QHashPrivate::Node<QSimplexVariable_*,_double>_>::Bucket::isUnused
                    ((Bucket *)0x95388b);
  if (bVar2) {
    pNVar3 = (Node<QSimplexVariable_*,_double> *)0x0;
  }
  else {
    pNVar3 = Data<QHashPrivate::Node<QSimplexVariable_*,_double>_>::Bucket::node((Bucket *)0x9538a6)
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pNVar3;
  }
  __stack_chk_fail();
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }